

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall
Model_takeImportedUnitsByName_Test::TestBody(Model_takeImportedUnitsByName_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ModelPtr model;
  UnitsPtr takeUnits2;
  UnitsPtr takeUnits1;
  long *local_70;
  unsigned_long local_68;
  long *local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  long local_50 [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  commonSetupImportedUnits();
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"myImportedUnits","");
  libcellml::Model::takeUnits(local_20);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"myConcreteUnits","");
  libcellml::Model::takeUnits(local_30);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  local_70 = (long *)0x0;
  local_68 = libcellml::Model::unitsCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_60,"size_t(0)","model->unitsCount()",(unsigned_long *)&local_70,
             &local_68);
  if (local_60._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x36f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_70 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

TEST(Model, takeImportedUnitsByName)
{
    auto model = commonSetupImportedUnits();

    auto takeUnits1 = model->takeUnits("myImportedUnits");
    auto takeUnits2 = model->takeUnits("myConcreteUnits");

    EXPECT_EQ(size_t(0), model->unitsCount());
}